

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::XmlSerializer(XmlSerializer *this,XmlReader *xmlReader)

{
  XmlReader *xmlReader_local;
  XmlSerializer *this_local;
  
  std::
  vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ::vector(&this->mMetaData);
  memset(&this->mMeshes,0,0x18);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->mMeshes);
  memset(&this->mMatArray,0,0x18);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector(&this->mMatArray);
  this->mActiveMatGroup = 99999999;
  memset(&this->mMatId2MatArray,0,0x30);
  std::
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::map(&this->mMatId2MatArray);
  this->xmlReader = xmlReader;
  return;
}

Assistant:

XmlSerializer(XmlReader* xmlReader)
    : mMeshes()
    , mMatArray()
    , mActiveMatGroup( 99999999 )
    , mMatId2MatArray()
    , xmlReader(xmlReader){
		// empty
    }